

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O1

void __thiscall
ncnn::Unfold::make_padding(Unfold *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float v;
  Option opt_b;
  
  iVar6 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar7 = (this->kernel_w + -1) * this->dilation_w;
  iVar9 = (this->kernel_h + -1) * this->dilation_h;
  if (bottom_blob_bordered != bottom_blob) {
    piVar5 = bottom_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    piVar5 = bottom_blob_bordered->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (bottom_blob_bordered->allocator == (Allocator *)0x0) {
          if (bottom_blob_bordered->data != (void *)0x0) {
            free(bottom_blob_bordered->data);
          }
        }
        else {
          (*bottom_blob_bordered->allocator->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blob_bordered->cstep = 0;
    bottom_blob_bordered->data = (void *)0x0;
    bottom_blob_bordered->refcount = (int *)0x0;
    *(undefined8 *)((long)&bottom_blob_bordered->refcount + 4) = 0;
    *(undefined8 *)((long)&bottom_blob_bordered->elemsize + 4) = 0;
    bottom_blob_bordered->dims = 0;
    bottom_blob_bordered->w = 0;
    bottom_blob_bordered->h = 0;
    bottom_blob_bordered->d = 0;
    bottom_blob_bordered->c = 0;
    piVar5 = bottom_blob->refcount;
    bottom_blob_bordered->data = bottom_blob->data;
    bottom_blob_bordered->refcount = piVar5;
    bottom_blob_bordered->elemsize = bottom_blob->elemsize;
    bottom_blob_bordered->elempack = bottom_blob->elempack;
    bottom_blob_bordered->allocator = bottom_blob->allocator;
    iVar8 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    iVar3 = bottom_blob->d;
    bottom_blob_bordered->dims = bottom_blob->dims;
    bottom_blob_bordered->w = iVar8;
    bottom_blob_bordered->h = iVar2;
    bottom_blob_bordered->d = iVar3;
    bottom_blob_bordered->c = bottom_blob->c;
    bottom_blob_bordered->cstep = bottom_blob->cstep;
  }
  iVar8 = this->pad_left;
  if ((((iVar8 < 1) && (iVar2 = this->pad_right, iVar2 < 1)) && (iVar3 = this->pad_top, iVar3 < 1))
     && (iVar4 = this->pad_bottom, iVar4 < 1)) {
    if (iVar4 == -0xe9 && (iVar3 == -0xe9 && (iVar2 == -0xe9 && iVar8 == -0xe9))) {
      iVar7 = iVar7 - (iVar6 + -1) % this->stride_w;
      iVar9 = iVar9 - (iVar1 + -1) % this->stride_h;
      if ((iVar7 < 1) && (iVar9 < 1)) {
        return;
      }
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_reserved_0 = opt->use_reserved_0;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_shader_local_memory = opt->use_shader_local_memory;
      opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar6 = iVar9 / 2;
      iVar9 = iVar9 - iVar6;
      iVar8 = iVar7 / 2;
      iVar7 = iVar7 - iVar8;
      v = this->pad_value;
    }
    else {
      if (iVar4 != -0xea || (iVar3 != -0xea || (iVar2 != -0xea || iVar8 != -0xea))) {
        return;
      }
      iVar8 = iVar7 - (iVar6 + -1) % this->stride_w;
      iVar6 = iVar9 - (iVar1 + -1) % this->stride_h;
      if ((iVar8 < 1) && (iVar6 < 1)) {
        return;
      }
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_reserved_0 = opt->use_reserved_0;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_shader_local_memory = opt->use_shader_local_memory;
      opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar9 = iVar6 / 2;
      iVar6 = iVar6 - iVar9;
      iVar7 = iVar8 / 2;
      iVar8 = iVar8 - iVar7;
      v = this->pad_value;
    }
  }
  else {
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_basic = opt->use_subgroup_basic;
    opt_b.use_subgroup_vote = opt->use_subgroup_vote;
    opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_reserved_7 = opt->use_reserved_7;
    opt_b.use_reserved_8 = opt->use_reserved_8;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar7 = this->pad_right;
    iVar6 = this->pad_top;
    iVar9 = this->pad_bottom;
    v = this->pad_value;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,iVar6,iVar9,iVar8,iVar7,0,v,&opt_b);
  return;
}

Assistant:

void Unfold::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}